

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_2.cpp
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char op;
  int a;
  int b;
  int iVar2;
  ostream *poVar3;
  string local_50;
  
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"First number","");
  a = get_number(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Second number","");
  b = get_number(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Operator [+ - * /]","");
  op = get_sym(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  iVar2 = evaluate(a,b,op);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Result of ",10);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  local_50._M_dataplus._M_p._0_1_ = op;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
  local_50._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_50,1);
  return 0;
}

Assistant:

int main()
{
	int const a = get_number("First number");
	int const b = get_number("Second number");
	char const op = get_sym("Operator [+ - * /]");
	int const c = evaluate(a, b, op);

	cout << "Result of " << a << " " << op << " " << b << " = " << c << '\n';

	return EXIT_SUCCESS;
}